

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O0

LY_ERR lyplg_type_print_xpath10_value
                 (lyd_value_xpath10 *xp_val,LY_VALUE_FORMAT format,void *prefix_data,
                 char **str_value,ly_err_item **err)

{
  void *local_50;
  ly_set *mods;
  lys_module *local_mod;
  uint16_t local_36;
  uint32_t str_len;
  uint16_t expr_idx;
  ly_err_item **pplStack_30;
  LY_ERR ret;
  ly_err_item **err_local;
  char **str_value_local;
  void *prefix_data_local;
  lyd_value_xpath10 *plStack_10;
  LY_VALUE_FORMAT format_local;
  lyd_value_xpath10 *xp_val_local;
  
  str_len = 0;
  local_36 = 0;
  local_mod._4_4_ = 0;
  mods = (ly_set *)0x0;
  *str_value = (char *)0x0;
  *err = (ly_err_item *)0x0;
  if (format == LY_VALUE_XML) {
    mods = (ly_set *)**(undefined8 **)((long)prefix_data + 8);
    **(undefined8 **)((long)prefix_data + 8) = 0;
    local_50 = prefix_data;
  }
  pplStack_30 = err;
  err_local = (ly_err_item **)str_value;
  str_value_local = (char **)prefix_data;
  prefix_data_local._4_4_ = format;
  plStack_10 = xp_val;
  str_len = xpath10_print_subexpr_r
                      (&local_36,LYXP_TOKEN_NONE,(lys_module *)0x0,xp_val,format,prefix_data,
                       str_value,(uint32_t *)((long)&local_mod + 4),err);
  if (mods != (ly_set *)0x0) {
    **(undefined8 **)((long)local_50 + 8) = mods;
  }
  if (str_len != LY_SUCCESS) {
    free(*err_local);
    *err_local = (ly_err_item *)0x0;
  }
  return str_len;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_print_xpath10_value(const struct lyd_value_xpath10 *xp_val, LY_VALUE_FORMAT format, void *prefix_data,
        char **str_value, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    uint16_t expr_idx = 0;
    uint32_t str_len = 0;
    const struct lys_module *local_mod = NULL;
    struct ly_set *mods;

    *str_value = NULL;
    *err = NULL;

    if (format == LY_VALUE_XML) {
        /* null the local module so that all the prefixes are printed */
        mods = prefix_data;
        local_mod = mods->objs[0];
        mods->objs[0] = NULL;
    }

    /* recursively print the expression */
    ret = xpath10_print_subexpr_r(&expr_idx, 0, NULL, xp_val, format, prefix_data, str_value, &str_len, err);

    if (local_mod) {
        mods->objs[0] = (void *)local_mod;
    }
    if (ret) {
        free(*str_value);
        *str_value = NULL;
    }
    return ret;
}